

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

FuncInfo * __thiscall
ByteCodeGenerator::StartBindFunction
          (ByteCodeGenerator *this,char16 *name,uint nameLength,uint shortNameOffset,
          bool *pfuncExprWithName,ParseNodeFnc *pnodeFnc,ParseableFunctionInfo *reuseNestedFunc)

{
  Type *pTVar1;
  Type TVar2;
  FncFlags FVar3;
  FunctionInfo *pFVar4;
  Utf8SourceInfo *this_00;
  ParseNodeBlock *pPVar5;
  ArenaAllocator *pAVar6;
  code *pcVar7;
  bool bVar8;
  ushort uVar9;
  charcount_t cVar10;
  PropertyId PVar11;
  uint uVar12;
  undefined4 *puVar13;
  void *pvVar14;
  ParseableFunctionInfo *pPVar15;
  ByteBlock *pBVar16;
  FunctionBody *pFVar17;
  Symbol *sym;
  Scope *paramScope;
  Scope *bodyScope;
  FuncInfo *this_01;
  Attributes AVar18;
  Attributes AVar19;
  char *pcVar20;
  FncFlags FVar21;
  char16 *key;
  ByteCodeGenerator *this_02;
  Scope *innerScope;
  char cVar22;
  undefined1 auStack_68 [8];
  AutoRestoreFunctionInfo autoRestoreFunctionInfo;
  
  if (reuseNestedFunc == (ParseableFunctionInfo *)0x0) {
    autoRestoreFunctionInfo.funcBody = (FunctionBody *)0x0;
  }
  else {
    if ((reuseNestedFunc->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar8) goto LAB_00830d8d;
      *puVar13 = 0;
    }
    if ((ParseableFunctionInfo *)
        (((reuseNestedFunc->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr !=
        reuseNestedFunc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar8) goto LAB_00830d8d;
      *puVar13 = 0;
    }
    autoRestoreFunctionInfo.funcBody =
         (FunctionBody *)
         Js::FunctionInfo::GetOriginalEntryPoint_Unchecked
                   ((reuseNestedFunc->super_FunctionProxy).functionInfo.ptr);
  }
  auStack_68 = (undefined1  [8])reuseNestedFunc;
  autoRestoreFunctionInfo.pfi = (ParseableFunctionInfo *)0x0;
  if ((this->pCurrentFunction == (FunctionBody *)0x0) ||
     (bVar8 = Js::ParseableFunctionInfo::IsFunctionParsed
                        (&this->pCurrentFunction->super_ParseableFunctionInfo), !bVar8)) {
    FVar3 = pnodeFnc->fncFlags;
    AVar18 = (int)(FVar3 * 8) >> 0x1f & (Async|ErrorOnNew);
    AVar19 = AVar18 | (Lambda|ErrorOnNew);
    if ((FVar3 >> 0xd & 1) == 0) {
      AVar19 = AVar18;
    }
    AVar19 = FVar3 >> 8 & SuperReference | AVar19;
    if ((FVar3 >> 0x14 & 1) != 0) {
      if ((FVar3 >> 0x12 & 1) == 0) {
        AVar19 = AVar19 | (ClassMethod|ErrorOnNew);
      }
      else {
        AVar19 = AVar19 + (FVar3 & kFunctionIsBaseClassConstructor) * 4 | ClassConstructor;
      }
    }
    FVar21 = FVar3 & kFunctionIsClassConstructor;
    AVar19 = (FVar3 & kFunctionIsModule) << 7 | FVar3 >> 6 & ErrorOnNew |
             (FVar21 == kFunctionNone | Method) & (int)(FVar3 << 0xe) >> 0x1f |
             ((FVar3 & kFunctionHasNonSimpleParameterList) << 0xc | Generator) &
             (int)(FVar3 << 6) >> 0x1f | AVar19;
    AVar18 = AVar19 | CanDefer;
    if (pnodeFnc->canBeDeferred == false) {
      AVar18 = AVar19;
    }
    if (((FVar3 >> 0xb & 1) != 0) && (pnodeFnc->pnodeName == (ParseNodeVar *)0x0)) {
      AVar18 = AVar18 | ComputedName;
    }
    cVar22 = *pfuncExprWithName;
    AVar18 = (FVar3 & kFunctionHasHomeObj) << 4 | AVar18;
    pFVar17 = (FunctionBody *)reuseNestedFunc;
    if ((DAT_015aa3a0 == '\0') || (pnodeFnc->pnodeBody != (ParseNodePtr)0x0)) {
      if (reuseNestedFunc == (ParseableFunctionInfo *)0x0) {
        pFVar17 = Js::FunctionBody::NewFromRecycler
                            (this->scriptContext,name,nameLength,shortNameOffset,
                             pnodeFnc->nestedCount,this->m_utf8SourceInfo,
                             ((((this->m_utf8SourceInfo->m_srcInfo).ptr)->sourceContextInfo).ptr)->
                             sourceContextId,pnodeFnc->functionId,AVar18,
                             (FunctionBodyFlags)(FVar21 >> 0xc) ^ Flags_HasNoExplicitReturnValue);
      }
      else {
        bVar8 = Js::FunctionProxy::IsFunctionBody(&reuseNestedFunc->super_FunctionProxy);
        if (bVar8) {
          bVar8 = Js::FunctionProxy::IsFunctionBody(&reuseNestedFunc->super_FunctionProxy);
          if (!bVar8) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                               ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
            if (!bVar8) goto LAB_00830d8d;
            *puVar13 = 0;
          }
        }
        else {
          this_00 = (reuseNestedFunc->super_FunctionProxy).m_utf8SourceInfo.ptr;
          if ((reuseNestedFunc->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar13 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                               ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
            if (!bVar8) goto LAB_00830d8d;
            *puVar13 = 0;
          }
          Js::Utf8SourceInfo::StopTrackingDeferredFunction
                    (this_00,((reuseNestedFunc->super_FunctionProxy).functionInfo.ptr)->functionId);
          pPVar15 = Js::FunctionProxy::GetParseableFunctionInfo
                              (&reuseNestedFunc->super_FunctionProxy);
          pFVar17 = Js::FunctionBody::NewFromParseableFunctionInfo(pPVar15);
          autoRestoreFunctionInfo.pfi = &pFVar17->super_ParseableFunctionInfo;
        }
        if ((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
            (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x545,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar8) goto LAB_00830d8d;
          *puVar13 = 0;
        }
        if ((FunctionBody *)
            (((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
            functionBodyImpl).ptr != pFVar17) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                             "GetFunctionInfo()->GetFunctionProxy() == this");
          if (!bVar8) goto LAB_00830d8d;
          *puVar13 = 0;
        }
        if (((AVar18 ^ ((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                       ->attributes) &
            (GeneratorWithComplexParams|HomeObj|ComputedName|Method|BaseConstructorKind|Module|Async
             |Generator|Lambda|ClassConstructor|ClassMethod|SuperReference|ErrorOnNew)) != None) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x57c,
                             "((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask))"
                             ,
                             "(parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask)"
                            );
          goto LAB_00830800;
        }
      }
    }
    else if (reuseNestedFunc == (ParseableFunctionInfo *)0x0) {
      pFVar17 = (FunctionBody *)
                Js::ParseableFunctionInfo::New
                          (this->scriptContext,pnodeFnc->nestedCount,pnodeFnc->functionId,
                           this->m_utf8SourceInfo,name,nameLength,shortNameOffset,AVar18,
                           (FunctionBodyFlags)(FVar21 >> 0xc) ^ Flags_HasNoExplicitReturnValue);
    }
    else {
      bVar8 = Js::FunctionProxy::IsFunctionBody(&reuseNestedFunc->super_FunctionProxy);
      if (bVar8) {
        bVar8 = Js::FunctionProxy::IsFunctionBody(&reuseNestedFunc->super_FunctionProxy);
        if (!bVar8) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                             ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
          if (!bVar8) goto LAB_00830d8d;
          *puVar13 = 0;
        }
        pBVar16 = Js::FunctionBody::GetByteCode((FunctionBody *)reuseNestedFunc);
        if (pBVar16 == (ByteBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x590,
                             "(!reuseNestedFunc->IsFunctionBody() || reuseNestedFunc->GetFunctionBody()->GetByteCode() != nullptr)"
                             ,
                             "!reuseNestedFunc->IsFunctionBody() || reuseNestedFunc->GetFunctionBody()->GetByteCode() != nullptr"
                            );
          if (!bVar8) goto LAB_00830d8d;
          *puVar13 = 0;
        }
      }
      if (pnodeFnc->pnodeBody != (ParseNodePtr)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x591,"(pnodeFnc->pnodeBody == nullptr)",
                           "pnodeFnc->pnodeBody == nullptr");
        if (!bVar8) goto LAB_00830d8d;
        *puVar13 = 0;
      }
      if ((reuseNestedFunc->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x545,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar8) goto LAB_00830d8d;
        *puVar13 = 0;
      }
      if ((ParseableFunctionInfo *)
          (((reuseNestedFunc->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr !=
          reuseNestedFunc) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                           "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar8) goto LAB_00830d8d;
        *puVar13 = 0;
      }
      if (((AVar18 ^ ((reuseNestedFunc->super_FunctionProxy).functionInfo.ptr)->attributes) &
          (GeneratorWithComplexParams|HomeObj|ComputedName|Method|BaseConstructorKind|Module|Async|
           Generator|Lambda|ClassConstructor|ClassMethod|SuperReference|ErrorOnNew)) != None) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x593,
                           "((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask))"
                           ,
                           "(parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask)"
                          );
LAB_00830800:
        if (bVar8 == false) goto LAB_00830d8d;
        *puVar13 = 0;
      }
    }
    Js::JavascriptLibrary::RegisterDynamicFunctionReference
              ((this->scriptContext->super_ScriptContextBase).javascriptLibrary,
               (FunctionProxy *)pFVar17);
    (pFVar17->super_ParseableFunctionInfo).deferredParseNextFunctionId =
         pnodeFnc->deferredParseNextFunctionId;
    uVar9 = (*(ushort *)&(pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 &
            0xfffb) + ((ushort)pnodeFnc->fncFlags & 2) * 2;
    *(ushort *)&(pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 = uVar9;
    (pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 =
         (pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0xdf |
         (byte)(pnodeFnc->fncFlags >> 0xc) & 0x20;
    uVar12 = (ushort)(short)pnodeFnc->fncFlags >> 3 & 8;
    *(ushort *)&(pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 =
         uVar9 & 0xfff7 | (ushort)uVar12;
    if ((pnodeFnc->fncFlags & kFunctionIsAccessor) != kFunctionNone) {
      Js::ScriptContextOptimizationOverrideInfo::SetSideEffects
                (&this->scriptContext->optimizationOverrides,SideEffects_Accessor);
    }
  }
  else {
    cVar10 = Js::ParseableFunctionInfo::StartInDocument
                       (&this->pCurrentFunction->super_ParseableFunctionInfo);
    if (cVar10 != (pnodeFnc->super_ParseNode).ichMin) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x534,"(this->pCurrentFunction->StartInDocument() == pnodeFnc->ichMin)",
                         "this->pCurrentFunction->StartInDocument() == pnodeFnc->ichMin");
      if (!bVar8) goto LAB_00830d8d;
      *puVar13 = 0;
    }
    if ((this->pCurrentFunction->super_ParseableFunctionInfo).m_cchLength !=
        (pnodeFnc->super_ParseNode).ichLim - (pnodeFnc->super_ParseNode).ichMin) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x535,
                         "(this->pCurrentFunction->LengthInChars() == pnodeFnc->LengthInCodepoints())"
                         ,
                         "this->pCurrentFunction->LengthInChars() == pnodeFnc->LengthInCodepoints()"
                        );
      if (!bVar8) goto LAB_00830d8d;
      *puVar13 = 0;
    }
    pFVar17 = this->pCurrentFunction;
    Js::FunctionBody::RemoveDeferParseAttribute(pFVar17);
    if ((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x53e,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar8) goto LAB_00830d8d;
      *puVar13 = 0;
    }
    if ((FunctionBody *)
        (((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
        functionBodyImpl).ptr != pFVar17) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x53f,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar8) goto LAB_00830d8d;
      *puVar13 = 0;
    }
    if (((((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->attributes
         & DeferredParse) != None) &&
       (((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x10) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x53c,
                         "(!parsedFunctionBody->IsDeferredParseFunction() || parsedFunctionBody->IsReparsed())"
                         ,
                         "!parsedFunctionBody->IsDeferredParseFunction() || parsedFunctionBody->IsReparsed()"
                        );
      if (!bVar8) goto LAB_00830d8d;
      *puVar13 = 0;
    }
    pnodeFnc->fncFlags =
         *(ushort *)&(pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 >> 1 &
         kFunctionDeclaration |
         pnodeFnc->fncFlags &
         (kFunctionHasAnyWriteToFormals|kFunctionIsDefaultModuleExport|kFunctionHasDirectSuper|
          kFunctionIsAsync|kFunctionIsDeclaredInParamScope|kFunctionAsmjsMode|kFunctionIsGenerator|
          kFunctionIsStaticMember|kFunctionHasDefaultArguments|kFunctionIsGeneratedDefault|
          kFunctionHasHomeObj|kFunctionIsClassMember|kFunctionIsBaseClassConstructor|
          kFunctionIsClassConstructor|kFunctionIsMethod|kFunctionHasSuperReference|
          kFunctionHasNonSimpleParameterList|kFunctionChildCallsEval|kFunctionIsLambda|
          kFunctionHasWithStmt|kFunctionHasComputedName|kFunctionIsModule|
          kFunctionHasDestructuredParams|kFunctionStrictMode|kFunctionHasNonThisStmt|
          kFunctionIsAccessor|kFunctionHasReferenceableBuiltInArguments|kFunctionHasHeapArguments|
          kFunctionUsesArguments|kFunctionCallsEval|kFunctionNested);
    if (pnodeFnc->canBeDeferred == false) {
      if ((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x545,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar8) goto LAB_00830d8d;
        *puVar13 = 0;
      }
      if ((FunctionBody *)
          (((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
          functionBodyImpl).ptr != pFVar17) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                           "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar8) goto LAB_00830d8d;
        *puVar13 = 0;
      }
      pFVar4 = (pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      TVar2 = pFVar4->attributes;
      if (pFVar4 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x54c,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar8) goto LAB_00830d8d;
        *puVar13 = 0;
      }
      if ((FunctionBody *)
          (((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
          functionBodyImpl).ptr != pFVar17) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                           ,0x54d,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                           "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar8) goto LAB_00830d8d;
        *puVar13 = 0;
      }
      ((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->attributes =
           TVar2 & ~CanDefer;
    }
    if (((((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 & 4) == 0) &&
        ((pnodeFnc->fncFlags & kFunctionIsMethod) == kFunctionNone)) &&
       (pnodeFnc->pnodeName != (ParseNodeVar *)0x0)) {
      cVar22 = (pnodeFnc->pnodeName->super_ParseNode).nop == knopVarDecl;
    }
    else {
      cVar22 = false;
    }
    *pfuncExprWithName = (bool)cVar22;
    if ((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar8) goto LAB_00830d8d;
      *puVar13 = 0;
    }
    pcVar20 = (char *)pnodeFnc;
    if ((((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionId
         != pnodeFnc->functionId) &&
       ((bVar8 = Js::ScriptContext::IsScriptContextInNonDebugMode(this->scriptContext), bVar8 ||
        ((this->m_utf8SourceInfo->field_0xa8 & 4) != 0)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      pcVar20 = 
      "parsedFunctionBody->GetLocalFunctionId() == pnodeFnc->functionId || !IsInNonDebugMode()";
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x54a,
                         "(parsedFunctionBody->GetLocalFunctionId() == pnodeFnc->functionId || !IsInNonDebugMode())"
                         ,
                         "parsedFunctionBody->GetLocalFunctionId() == pnodeFnc->functionId || !IsInNonDebugMode()"
                        );
      if (!bVar8) goto LAB_00830d8d;
      *puVar13 = 0;
    }
    uVar12 = (uint)pcVar20;
    Js::FunctionBody::ResetByteCodeGenVisitState(pFVar17);
    pvVar14 = Js::FunctionProxy::GetAuxPtr((FunctionProxy *)pFVar17,ScopeInfo);
    if (pvVar14 != (void *)0x0) {
      pvVar14 = Js::FunctionProxy::GetAuxPtr((FunctionProxy *)pFVar17,ScopeInfo);
      if (*(FunctionInfo **)((long)pvVar14 + 8) == (FunctionInfo *)0x0) {
        pPVar15 = (ParseableFunctionInfo *)0x0;
      }
      else {
        pPVar15 = Js::FunctionInfo::GetParseableFunctionInfo(*(FunctionInfo **)((long)pvVar14 + 8));
      }
      if ((pPVar15 != (ParseableFunctionInfo *)0x0) &&
         ((pPVar15->flags & Flags_HasOrParentHasArguments) != Flags_None)) {
        pTVar1 = &(pFVar17->super_ParseableFunctionInfo).flags;
        *pTVar1 = *pTVar1 | Flags_HasOrParentHasArguments;
      }
    }
  }
  if (cVar22 == '\0') {
    innerScope = (Scope *)0x0;
  }
  else {
    innerScope = pnodeFnc->scope;
    if (innerScope == (Scope *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      uVar12 = 0x10cdfe6;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x5b1,"(funcExprScope)","funcExprScope");
      if (!bVar8) goto LAB_00830d8d;
      *puVar13 = 0;
    }
    this_02 = this;
    PushScope(this,innerScope);
    sym = AddSymbolToScope(this_02,innerScope,key,uVar12,&pnodeFnc->pnodeName->super_ParseNode,
                           STFunction);
    sym->field_0x42 = sym->field_0x42 | 0x20;
    PVar11 = Js::ParseableFunctionInfo::GetOrAddPropertyIdTracked
                       (&pFVar17->super_ParseableFunctionInfo,&sym->name);
    sym->position = PVar11;
    ParseNodeFnc::SetFuncSymbol(pnodeFnc,sym);
    if ((*(ushort *)&innerScope->field_0x44 & 2) != 0) {
      *(ushort *)&innerScope->field_0x44 = *(ushort *)&innerScope->field_0x44 | 0x10;
    }
  }
  pPVar5 = pnodeFnc->pnodeScopes;
  if (pPVar5 == (ParseNodeBlock *)0x0) {
    paramScope = (Scope *)0x0;
  }
  else {
    paramScope = pPVar5->scope;
  }
  if (pnodeFnc->pnodeBodyScope == (ParseNodeBlock *)0x0) {
    bodyScope = (Scope *)0x0;
  }
  else {
    bodyScope = pnodeFnc->pnodeBodyScope->scope;
  }
  if (paramScope == (Scope *)0x0) {
    if (pPVar5 != (ParseNodeBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x5c3,"(paramScope != nullptr || !pnodeFnc->pnodeScopes)",
                         "paramScope != nullptr || !pnodeFnc->pnodeScopes");
      if (!bVar8) goto LAB_00830d8d;
      *puVar13 = 0;
    }
    paramScope = (Scope *)new<Memory::ArenaAllocator>(0x48,this->alloc,0x366bee);
    pAVar6 = this->alloc;
    paramScope->enclosingScope = (Scope *)0x0;
    paramScope->scopeInfo = (ScopeInfo *)0x0;
    paramScope->location = 0xffffffff;
    paramScope->func = (FuncInfo *)0x0;
    paramScope->m_symList = (Symbol *)0x0;
    paramScope->m_count = 0;
    paramScope->alloc = pAVar6;
    paramScope->scopeSlotCount = 0;
    paramScope->innerScopeIndex = 0xffffffff;
    paramScope->scopeType = ScopeType_Parameter;
    *(ushort *)&paramScope->field_0x44 =
         (ushort)*(undefined4 *)&paramScope->field_0x44 & 0xf000 | 0x84;
    if (pnodeFnc->pnodeScopes != (ParseNodeBlock *)0x0) {
      pnodeFnc->pnodeScopes->scope = paramScope;
    }
  }
  if (bodyScope == (Scope *)0x0) {
    bodyScope = (Scope *)new<Memory::ArenaAllocator>(0x48,this->alloc,0x366bee);
    pAVar6 = this->alloc;
    bodyScope->enclosingScope = (Scope *)0x0;
    bodyScope->scopeInfo = (ScopeInfo *)0x0;
    bodyScope->location = 0xffffffff;
    bodyScope->func = (FuncInfo *)0x0;
    bodyScope->m_symList = (Symbol *)0x0;
    bodyScope->m_count = 0;
    bodyScope->alloc = pAVar6;
    bodyScope->scopeSlotCount = 0;
    bodyScope->innerScopeIndex = 0xffffffff;
    bodyScope->scopeType = ScopeType_FunctionBody;
    *(ushort *)&bodyScope->field_0x44 =
         (ushort)*(undefined4 *)&bodyScope->field_0x44 & 0xf000 | 0x84;
    if (pnodeFnc->pnodeBodyScope != (ParseNodeBlock *)0x0) {
      pnodeFnc->pnodeBodyScope->scope = bodyScope;
    }
  }
  if ((pnodeFnc->super_ParseNode).nop != knopFncDecl) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x5d5,"(pnodeFnc->nop == knopFncDecl)",
                       "Non-function declaration trying to create function body");
    if (!bVar8) goto LAB_00830d8d;
    *puVar13 = 0;
  }
  uVar9 = *(ushort *)&(pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 & 0xefff
  ;
  *(ushort *)&(pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 = uVar9;
  if ((pnodeFnc->fncFlags & kFunctionStrictMode) != kFunctionNone) {
    *(ushort *)&(pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 =
         uVar9 | 0x100;
  }
  this_01 = (FuncInfo *)new<Memory::ArenaAllocator>(0x300,this->alloc,0x366bee);
  FuncInfo::FuncInfo(this_01,name,this->alloc,this,paramScope,bodyScope,pnodeFnc,
                     &pFVar17->super_ParseableFunctionInfo);
  *(uint *)&this_01->field_0xb4 =
       *(uint *)&this_01->field_0xb4 & 0xfffeffff |
       (uint)(reuseNestedFunc != (ParseableFunctionInfo *)0x0) << 0x10;
  if ((pnodeFnc->fncFlags & kFunctionHasHeapArguments) != kFunctionNone) {
    FuncEscapes(this,bodyScope);
    FuncInfo::SetHasMaybeEscapedNestedFunc(this_01,L"ArgumentsObjectEscapes");
  }
  bVar8 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar17);
  if (bVar8) {
    bVar8 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar17);
    if (!bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar8) {
LAB_00830d8d:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar13 = 0;
    }
    if (((pFVar17->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x10) == 0) {
      Js::FunctionBody::SaveState(pFVar17,pnodeFnc);
    }
    else {
      Js::FunctionBody::RestoreState(pFVar17,pnodeFnc);
    }
  }
  uVar12 = *(uint *)&this_01->field_0xb4 & 0xfffffffb | pnodeFnc->fncFlags >> 0xc & 4;
  *(uint *)&this_01->field_0xb4 = uVar12;
  if ((pnodeFnc->fncFlags & kFunctionCallsEval) != kFunctionNone) {
    *(uint *)&this_01->field_0xb4 = uVar12 | 2;
    bodyScope->field_0x44 = bodyScope->field_0x44 | 1;
    Scope::SetIsObject(bodyScope);
    bodyScope->field_0x44 = bodyScope->field_0x44 | 0x18;
    Scope::SetIsObject(paramScope);
    paramScope->field_0x44 = paramScope->field_0x44 | 0x18;
  }
  PushFuncInfo(this,L"StartBindFunction",this_01);
  if (innerScope != (Scope *)0x0) {
    innerScope->func = this_01;
    this_01->funcExprScope = innerScope;
  }
  if (this->maxAstSize < pnodeFnc->astSize) {
    this->maxAstSize = pnodeFnc->astSize;
  }
  auStack_68 = (undefined1  [8])0x0;
  autoRestoreFunctionInfo.pfi = (ParseableFunctionInfo *)0x0;
  if (pnodeFnc->isBodyAndParamScopeMerged == false) {
    this_01->field_0xb5 = this_01->field_0xb5 & 0x7f;
  }
  Js::AutoRestoreFunctionInfo::~AutoRestoreFunctionInfo((AutoRestoreFunctionInfo *)auStack_68);
  return this_01;
}

Assistant:

FuncInfo * ByteCodeGenerator::StartBindFunction(const char16 *name, uint nameLength, uint shortNameOffset, bool* pfuncExprWithName, ParseNodeFnc *pnodeFnc, Js::ParseableFunctionInfo * reuseNestedFunc)
{
    bool funcExprWithName;
    Js::ParseableFunctionInfo* parseableFunctionInfo = nullptr;

    Js::AutoRestoreFunctionInfo autoRestoreFunctionInfo(reuseNestedFunc, reuseNestedFunc ? reuseNestedFunc->GetOriginalEntryPoint_Unchecked() : nullptr);

    if (this->pCurrentFunction &&
        this->pCurrentFunction->IsFunctionParsed())
    {
        Assert(this->pCurrentFunction->StartInDocument() == pnodeFnc->ichMin);
        Assert(this->pCurrentFunction->LengthInChars() == pnodeFnc->LengthInCodepoints());

        // This is the root function for the current AST subtree, and it already has a FunctionBody
        // (created by a deferred parse) which we're now filling in.
        Js::FunctionBody * parsedFunctionBody = this->pCurrentFunction;
        parsedFunctionBody->RemoveDeferParseAttribute();

        Assert(!parsedFunctionBody->IsDeferredParseFunction() || parsedFunctionBody->IsReparsed());

        pnodeFnc->SetDeclaration(parsedFunctionBody->GetIsDeclaration());
        if (!pnodeFnc->CanBeDeferred())
        {
            parsedFunctionBody->SetAttributes(
                (Js::FunctionInfo::Attributes)(parsedFunctionBody->GetAttributes() & ~Js::FunctionInfo::Attributes::CanDefer));
        }
        funcExprWithName =
            !(parsedFunctionBody->GetIsDeclaration() || pnodeFnc->IsMethod()) &&
            pnodeFnc->pnodeName != nullptr &&
            pnodeFnc->pnodeName->nop == knopVarDecl;
        *pfuncExprWithName = funcExprWithName;

        Assert(parsedFunctionBody->GetLocalFunctionId() == pnodeFnc->functionId || !IsInNonDebugMode());

        // Some state may be tracked on the function body during the visit pass. Since the previous visit pass may have failed,
        // we need to reset the state on the function body.
        parsedFunctionBody->ResetByteCodeGenVisitState();

        if (parsedFunctionBody->GetScopeInfo())
        {
            // Propagate flags from the (real) parent function.
            Js::ParseableFunctionInfo *parent = parsedFunctionBody->GetScopeInfo()->GetParseableFunctionInfo();
            if (parent)
            {
                if (parent->GetHasOrParentHasArguments())
                {
                    parsedFunctionBody->SetHasOrParentHasArguments(true);
                }
            }
        }

        parseableFunctionInfo = parsedFunctionBody;
    }
    else
    {
        funcExprWithName = *pfuncExprWithName;
        Js::LocalFunctionId functionId = pnodeFnc->functionId;

        // Create a function body if:
        //  1. The parse node is not defer parsed
        //  2. Or creating function proxies is disallowed
        bool createFunctionBody = (pnodeFnc->pnodeBody != nullptr);
        if (!CONFIG_FLAG(CreateFunctionProxy)) createFunctionBody = true;

        const Js::FunctionInfo::Attributes attributes = GetFunctionInfoAttributes(pnodeFnc);

        if (createFunctionBody)
        {
            if (reuseNestedFunc)
            {
                if (!reuseNestedFunc->IsFunctionBody())
                {
                    reuseNestedFunc->GetUtf8SourceInfo()->StopTrackingDeferredFunction(reuseNestedFunc->GetLocalFunctionId());
                    Js::FunctionBody * parsedFunctionBody =
                        Js::FunctionBody::NewFromParseableFunctionInfo(reuseNestedFunc->GetParseableFunctionInfo());
                    autoRestoreFunctionInfo.funcBody = parsedFunctionBody;
                    parseableFunctionInfo = parsedFunctionBody;
                }
                else
                {
                    parseableFunctionInfo = reuseNestedFunc->GetFunctionBody();
                }
                Assert((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask));
            }
            else
            {
                parseableFunctionInfo = Js::FunctionBody::NewFromRecycler(scriptContext, name, nameLength, shortNameOffset, pnodeFnc->nestedCount, m_utf8SourceInfo,
                    m_utf8SourceInfo->GetSrcInfo()->sourceContextInfo->sourceContextId, functionId
                    , attributes
                    , pnodeFnc->IsClassConstructor() ?
                        Js::FunctionBody::FunctionBodyFlags::Flags_None :
                        Js::FunctionBody::FunctionBodyFlags::Flags_HasNoExplicitReturnValue
#ifdef PERF_COUNTERS
                    , false /* is function from deferred deserialized proxy */
#endif
                );
            }
        }
        else
        {
            if (reuseNestedFunc)
            {
                Assert(!reuseNestedFunc->IsFunctionBody() || reuseNestedFunc->GetFunctionBody()->GetByteCode() != nullptr);
                Assert(pnodeFnc->pnodeBody == nullptr);
                parseableFunctionInfo = reuseNestedFunc;
                Assert((parseableFunctionInfo->GetAttributes() & StableFunctionInfoAttributesMask) == (attributes & StableFunctionInfoAttributesMask));
            }
            else
            {
                parseableFunctionInfo = Js::ParseableFunctionInfo::New(scriptContext, pnodeFnc->nestedCount, functionId, m_utf8SourceInfo, name, nameLength, shortNameOffset, attributes,
                                        pnodeFnc->IsClassConstructor() ?
                                            Js::FunctionBody::FunctionBodyFlags::Flags_None :
                                            Js::FunctionBody::FunctionBodyFlags::Flags_HasNoExplicitReturnValue);
            }
        }

        // In either case register the function reference
        scriptContext->GetLibrary()->RegisterDynamicFunctionReference(parseableFunctionInfo);

#if DBG
        parseableFunctionInfo->deferredParseNextFunctionId = pnodeFnc->deferredParseNextFunctionId;
#endif
        parseableFunctionInfo->SetIsDeclaration(pnodeFnc->IsDeclaration() != 0);
        parseableFunctionInfo->SetIsMethod(pnodeFnc->IsMethod() != 0);
        parseableFunctionInfo->SetIsAccessor(pnodeFnc->IsAccessor() != 0);
        if (pnodeFnc->IsAccessor())
        {
            scriptContext->optimizationOverrides.SetSideEffects(Js::SideEffects_Accessor);
        }
    }

    Scope *funcExprScope = nullptr;
    if (funcExprWithName)
    {
        funcExprScope = pnodeFnc->scope;
        Assert(funcExprScope);
        PushScope(funcExprScope);
        Symbol *sym = AddSymbolToScope(funcExprScope, name, nameLength, pnodeFnc->pnodeName, STFunction);

        sym->SetIsFuncExpr(true);

        sym->SetPosition(parseableFunctionInfo->GetOrAddPropertyIdTracked(sym->GetName()));

        pnodeFnc->SetFuncSymbol(sym);

        if (funcExprScope->GetIsObject())
        {
            funcExprScope->SetMustInstantiate(true);
        }
    }

    Scope *paramScope = pnodeFnc->pnodeScopes ? pnodeFnc->pnodeScopes->scope : nullptr;
    Scope *bodyScope = pnodeFnc->pnodeBodyScope ? pnodeFnc->pnodeBodyScope->scope : nullptr;
    Assert(paramScope != nullptr || !pnodeFnc->pnodeScopes);
    if (paramScope == nullptr)
    {
        paramScope = Anew(alloc, Scope, alloc, ScopeType_Parameter, true);
        if (pnodeFnc->pnodeScopes)
        {
            pnodeFnc->pnodeScopes->scope = paramScope;
        }
    }
    if (bodyScope == nullptr)
    {
        bodyScope = Anew(alloc, Scope, alloc, ScopeType_FunctionBody, true);
        if (pnodeFnc->pnodeBodyScope)
        {
            pnodeFnc->pnodeBodyScope->scope = bodyScope;
        }
    }

    AssertMsg(pnodeFnc->nop == knopFncDecl, "Non-function declaration trying to create function body");

    parseableFunctionInfo->SetIsGlobalFunc(false);
    if (pnodeFnc->GetStrictMode() != 0)
    {
        parseableFunctionInfo->SetIsStrictMode();
    }

    FuncInfo *funcInfo = Anew(alloc, FuncInfo, name, alloc, this, paramScope, bodyScope, pnodeFnc, parseableFunctionInfo);

#if DBG
    funcInfo->isReused = (reuseNestedFunc != nullptr);
#endif

    if (pnodeFnc->GetArgumentsObjectEscapes())
    {
        // If the parser detected that the arguments object escapes, then the function scope escapes
        // and cannot be cached.
        this->FuncEscapes(bodyScope);
        funcInfo->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("ArgumentsObjectEscapes")));
    }

    if (parseableFunctionInfo->IsFunctionBody())
    {
        Js::FunctionBody * parsedFunctionBody = parseableFunctionInfo->GetFunctionBody();
        if (parsedFunctionBody->IsReparsed())
        {
            parsedFunctionBody->RestoreState(pnodeFnc);
        }
        else
        {
            parsedFunctionBody->SaveState(pnodeFnc);
        }
    }

    funcInfo->SetChildCallsEval(!!pnodeFnc->ChildCallsEval());

    if (pnodeFnc->CallsEval())
    {
        funcInfo->SetCallsEval(true);

        bodyScope->SetIsDynamic(true);
        bodyScope->SetIsObject();
        bodyScope->SetCapturesAll(true);
        bodyScope->SetMustInstantiate(true);

        // Do not mark param scope as dynamic as it does not leak declarations
        paramScope->SetIsObject();
        paramScope->SetCapturesAll(true);
        paramScope->SetMustInstantiate(true);
    }

    PushFuncInfo(_u("StartBindFunction"), funcInfo);

    if (funcExprScope)
    {
        funcExprScope->SetFunc(funcInfo);
        funcInfo->funcExprScope = funcExprScope;
    }

    int32 currentAstSize = pnodeFnc->astSize;
    if (currentAstSize > this->maxAstSize)
    {
        this->maxAstSize = currentAstSize;
    }

    autoRestoreFunctionInfo.Clear();

    if (!pnodeFnc->IsBodyAndParamScopeMerged())
    {
        funcInfo->ResetBodyAndParamScopeMerged();
    }

    return funcInfo;
}